

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * __thiscall BigInt::operator*(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  vll c;
  vll a;
  vll b;
  _Vector_base<long_long,_std::allocator<long_long>_> local_98;
  vector<long_long,_std::allocator<long_long>_> b6;
  vector<long_long,_std::allocator<long_long>_> a6;
  BigInt local_50;
  
  convert_base(&a6,&this->vector_value,base_digits,6);
  convert_base(&b6,&v->vector_value,base_digits,6);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)&a,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             a6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             a6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&b);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)&b,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             b6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             b6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&c);
  while( true ) {
    if ((ulong)((long)b.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)b.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start) <=
        (ulong)((long)a.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)a.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start)) break;
    c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>(&a,(longlong *)&c);
  }
  while ((ulong)((long)b.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)b.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start) <
         (ulong)((long)a.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)a.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start)) {
    c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>(&b,(longlong *)&c);
  }
  while (uVar1 = (long)a.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)a.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3, (uVar1 & uVar1 - 1) != 0) {
    c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>(&a,(longlong *)&c);
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              (&b,(longlong *)&local_98);
  }
  karatsubaMultiply(&c,&a,&b);
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->sign = v->sign * this->sign;
  lVar3 = 0;
  for (lVar4 = 0;
      lVar4 < (int)((ulong)((long)c.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3); lVar4 = lVar4 + 1) {
    lVar2 = (long)(int)lVar3 +
            c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    lVar3 = lVar2 / 1000000;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar2 % 1000000);
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              (&__return_storage_ptr__->vector_value,(longlong *)&local_98);
  }
  convert_base((vector<long_long,_std::allocator<long_long>_> *)&local_98,
               &__return_storage_ptr__->vector_value,6,base_digits);
  std::vector<long_long,_std::allocator<long_long>_>::_M_move_assign
            (&__return_storage_ptr__->vector_value,&local_98);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_98);
  trim(&local_50,__return_storage_ptr__);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_50);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&c.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&b.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&a.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&b6.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&a6.super__Vector_base<long_long,_std::allocator<long_long>_>);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator*(const BigInt &v) const { //! multiplication operator overloading
        /* //! works with deque
         BigInt result;
         BigInt This = *this;
         for (long long &vectorValue : that.vector_value) {
             result += This * vectorValue;
             This.vector_value.push_front(0); //! shift the least significant
         }

         return result;*/
        //! log on the value space 24 ms :(
        /* //! log mul
          if (that == __ONE__)
              return (*this);

          BigInt result;
          pair<BigInt, int> halfDiv = that.Half();
          result = (*this) * halfDiv.first;
          result = result.Double();
          //result += result;
          if (halfDiv.second)
              result = result + (*this);
          return result;*/


        vector<long long> a6 = convert_base(this->vector_value, base_digits, 6);
        vector<long long> b6 = convert_base(v.vector_value, base_digits, 6);
        vll a(a6.begin(), a6.end());
        vll b(b6.begin(), b6.end());
        while (a.size() < b.size())
            a.push_back(0);
        while (b.size() < a.size())
            b.push_back(0);
        while (a.size() & (a.size() - 1))
            a.push_back(0), b.push_back(0);
        vll c = karatsubaMultiply(a, b);
        BigInt res;
        res.sign = sign * v.sign;
        for (int i = 0, carry = 0; i < (int) c.size(); i++) {
            long long cur = c[i] + carry;
            res.vector_value.push_back((int) (cur % 1000000));
            carry = (int) (cur / 1000000);
        }
        res.vector_value = convert_base(res.vector_value, 6, base_digits);
        res.trim();
        return res;
    }